

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O2

void __thiscall num_parse_test_serial_signed_Test::TestBody(num_parse_test_serial_signed_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  array<unsigned_char,_4UL> bytes;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"4",(allocator<char> *)&local_48);
  bytes = mvm::num::serial<int,4ul,mvm::num::little_endian_tag>((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_48.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<std::array<unsigned_char,4ul>,std::array<unsigned_char,4ul>>
            ((internal *)&gtest_ar,"bytes","decltype(bytes)({0x04, 0x0, 0x0, 0x0})",&bytes,
             (array<unsigned_char,_4UL> *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x7f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"-4",(allocator<char> *)&local_48);
  bytes = mvm::num::serial<int,4ul,mvm::num::little_endian_tag>((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_48.ptr_._0_4_ = 0xfffffffc;
  testing::internal::CmpHelperEQ<std::array<unsigned_char,4ul>,std::array<unsigned_char,4ul>>
            ((internal *)&gtest_ar,"bytes","decltype(bytes)({0xfc, 0xff, 0xff, 0xff})",&bytes,
             (array<unsigned_char,_4UL> *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x82,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(num_parse_test, serial_signed) {
  auto bytes = serial<int32_t, 4, little_endian_tag>("4");
  EXPECT_EQ(bytes, decltype(bytes)({0x04, 0x0, 0x0, 0x0}));

  bytes = serial<int32_t, 4, little_endian_tag>("-4");
  EXPECT_EQ(bytes, decltype(bytes)({0xfc, 0xff, 0xff, 0xff}));
}